

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LowerArgIn(Lowerer *this,Instr *instrArgIn)

{
  OpCode OVar1;
  Opnd *pOVar2;
  StackSym *pSVar3;
  Opnd *pOVar4;
  Type pJVar5;
  _func_int **pp_Var6;
  code *pcVar7;
  bool bVar8;
  OpndKind OVar9;
  BOOLEAN BVar10;
  ArgSlot AVar11;
  ushort uVar12;
  ArgSlot AVar13;
  ArgSlot AVar14;
  int iVar15;
  undefined4 *puVar16;
  Opnd *dstOpnd;
  JITTimeFunctionBody *pJVar17;
  Instr *pIVar18;
  RegOpnd *pRVar19;
  Instr *pIVar20;
  LabelInstr *pLVar21;
  LabelInstr *branchTarget;
  BranchInstr *pBVar22;
  IntConstOpnd *pIVar23;
  undefined4 extraout_var;
  AddrOpnd *src;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  LabelInstr *pLVar24;
  Func *pFVar25;
  Lowerer *this_01;
  short sVar26;
  RegOpnd *local_88;
  Instr *local_70;
  Instr *local_50;
  ushort local_38;
  
  if (instrArgIn == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2ce3,"(instrArgIn)","instrArgIn");
    if (!bVar8) goto LAB_005b2e4e;
    *puVar16 = 0;
  }
  OVar1 = instrArgIn->m_opcode;
  if (OVar1 == ArgIn_Rest) {
    dstOpnd = IR::Instr::UnlinkDst(instrArgIn);
    pJVar17 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    bVar8 = JITTimeFunctionBody::HasImplicitArgIns(pJVar17);
    pFVar25 = this->m_func;
    if ((!bVar8) || (pFVar25->argInsCount == 0)) {
      if (instrArgIn->m_func != pFVar25) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar16 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2cf9,"(instrArgIn->m_func == this->m_func)",
                           "instrArgIn->m_func == this->m_func");
        if (!bVar8) goto LAB_005b2e4e;
        *puVar16 = 0;
        pFVar25 = this->m_func;
      }
      AVar11 = Func::GetInParamsCount(pFVar25);
      pRVar19 = (RegOpnd *)0x0;
      pIVar18 = LowererMD::LoadInputParamCount(&this->m_lowererMD,instrArgIn,-(uint)AVar11,false);
      pOVar2 = pIVar18->m_dst;
      pLVar21 = IR::LabelInstr::New(Label,this->m_func,false);
      this_01 = (Lowerer *)0x0;
      pIVar23 = IR::IntConstOpnd::New(0,TyUint8,this->m_func,false);
      InsertCompareBranch(this_01,pOVar2,&pIVar23->super_Opnd,BrGe_A,false,pLVar21,instrArgIn,false)
      ;
      pIVar23 = IR::IntConstOpnd::New(0,TyUint8,this->m_func,false);
      InsertMove(pOVar2,&pIVar23->super_Opnd,instrArgIn,true);
      IR::Instr::InsertBefore(instrArgIn,&pLVar21->super_Instr);
      pJVar17 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      bVar8 = JITTimeFunctionBody::IsCoroutine(pJVar17);
      if (bVar8) {
        bVar8 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
        if (bVar8) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2d0a,"(!m_func->IsLoopBody())",
                             "LoopBody Jit should not involve Rest params");
          if (!bVar8) goto LAB_005b2e4e;
          *puVar16 = 0;
        }
        pRVar19 = LoadGeneratorArgsPtr(instrArgIn);
      }
      AVar11 = Func::GetInParamsCount(this->m_func);
      pIVar23 = IR::IntConstOpnd::New((ulong)AVar11,TyUint32,this->m_func,false);
      pIVar18 = LowerRestParameter(this,&pIVar23->super_Opnd,dstOpnd,pOVar2,instrArgIn,pRVar19);
      IR::Instr::Remove(instrArgIn);
      return pIVar18;
    }
    pIVar18 = instrArgIn;
    if (instrArgIn->m_opcode == ArgIn_A) {
      local_70 = (Instr *)0x0;
    }
    else {
      local_70 = (Instr *)0x0;
      do {
        pIVar18 = pIVar18->m_prev;
        if (local_70 == (Instr *)0x0) {
          local_70 = pIVar18;
        }
      } while (pIVar18->m_opcode != ArgIn_A);
    }
    IR::Instr::Remove(instrArgIn);
    instrArgIn = pIVar18;
  }
  else {
    dstOpnd = (Opnd *)0x0;
    local_70 = (Instr *)0x0;
  }
  pOVar2 = instrArgIn->m_src1;
  OVar9 = IR::Opnd::GetKind(pOVar2);
  if (OVar9 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar8) goto LAB_005b2e4e;
    *puVar16 = 0;
  }
  pSVar3 = (StackSym *)pOVar2[1]._vptr_Opnd;
  if ((pSVar3->super_Sym).m_kind != SymKindStack) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar8) goto LAB_005b2e4e;
    *puVar16 = 0;
  }
  local_38 = StackSym::GetParamSlotNum(pSVar3);
  if (local_38 == 1) {
    pJVar17 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    bVar8 = JITTimeFunctionBody::IsCoroutine(pJVar17);
    if ((bVar8) && (bVar8 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem), !bVar8)) {
      pRVar19 = LoadGeneratorArgsPtr(instrArgIn);
      ConvertArgOpndIfGeneratorFunction(this,instrArgIn,pRVar19);
    }
    LowererMD::ChangeToAssign(instrArgIn);
    if (local_70 == (Instr *)0x0) {
      local_70 = instrArgIn->m_prev;
    }
  }
  else {
    AVar11 = Func::GetInParamsCount(this->m_func);
    if (AVar11 < local_38) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2d28,"(argIndex <= formalsCount)",
                         "Expect to see the ArgIn\'s within the range of the formals");
      if (!bVar8) goto LAB_005b2e4e;
      *puVar16 = 0;
    }
    pFVar25 = this->m_func;
    uVar12 = pFVar25->argInsCount;
    if (uVar12 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2d30,"(this->m_func->argInsCount > 0)","this->m_func->argInsCount > 0");
      if (!bVar8) goto LAB_005b2e4e;
      *puVar16 = 0;
      pFVar25 = this->m_func;
      uVar12 = pFVar25->argInsCount;
    }
    pIVar18 = instrArgIn;
    if (uVar12 < 2) {
      uVar12 = 0;
    }
    else {
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      uVar12 = 0;
      do {
        pIVar18 = pIVar18->m_prev;
        if (pIVar18->m_opcode == ArgIn_A) {
          pOVar2 = pIVar18->m_src1;
          OVar9 = IR::Opnd::GetKind(pOVar2);
          if (OVar9 != OpndKindSym) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar16 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
            if (!bVar8) goto LAB_005b2e4e;
            *puVar16 = 0;
          }
          pSVar3 = (StackSym *)pOVar2[1]._vptr_Opnd;
          if ((pSVar3->super_Sym).m_kind != SymKindStack) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar16 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                               ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
            if (!bVar8) goto LAB_005b2e4e;
            *puVar16 = 0;
          }
          AVar13 = StackSym::GetParamSlotNum(pSVar3);
          if (local_38 <= AVar13) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar16 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x2d39,"(symParam->GetParamSlotNum() < argIndex)",
                               "ArgIn\'s not in numerical order");
            if (!bVar8) goto LAB_005b2e4e;
            *puVar16 = 0;
          }
          local_38 = StackSym::GetParamSlotNum(pSVar3);
          uVar12 = uVar12 + 1;
          pFVar25 = this->m_func;
        }
        else if (local_70 == (Instr *)0x0) {
          local_70 = pIVar18;
        }
      } while ((int)(uint)uVar12 < (int)(pFVar25->argInsCount - 1));
    }
    if (local_70 == (Instr *)0x0) {
      local_70 = pIVar18->m_prev;
    }
    pJVar17 = JITTimeWorkItem::GetJITFunctionBody(pFVar25->m_workItem);
    bVar8 = JITTimeFunctionBody::IsCoroutine(pJVar17);
    if (bVar8) {
      local_88 = LoadGeneratorArgsPtr(pIVar18);
    }
    else {
      local_88 = (RegOpnd *)0x0;
    }
    pIVar20 = LowererMD::LoadInputParamCount(&this->m_lowererMD,pIVar18,-(uint)AVar11,true);
    pOVar2 = pIVar20->m_dst;
    pLVar21 = IR::LabelInstr::New(Label,this->m_func,true);
    InsertBranch(BrLt_A,false,pLVar21,pIVar18);
    branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
    pBVar22 = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
    IR::Instr::InsertBefore(pIVar18,&pBVar22->super_Instr);
    IR::Instr::InsertBefore(pIVar18,&pLVar21->super_Instr);
    IR::Instr::InsertBefore(pIVar18,&branchTarget->super_Instr);
    pOVar4 = instrArgIn->m_src1;
    OVar9 = IR::Opnd::GetKind(pOVar4);
    if (OVar9 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar8) goto LAB_005b2e4e;
      *puVar16 = 0;
    }
    pSVar3 = (StackSym *)pOVar4[1]._vptr_Opnd;
    if ((pSVar3->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar8) goto LAB_005b2e4e;
      *puVar16 = 0;
    }
    AVar13 = StackSym::GetParamSlotNum(pSVar3);
    AVar14 = Func::GetInParamsCount(this->m_func);
    if (AVar14 != AVar13) {
      sVar26 = AVar13 - AVar14;
      do {
        pIVar23 = IR::IntConstOpnd::New(1,TyInt64,this->m_func,false);
        InsertAdd(true,pOVar2,pOVar2,&pIVar23->super_Opnd,&branchTarget->super_Instr);
        InsertBranch(BrEq_A,false,branchTarget,&branchTarget->super_Instr);
        sVar26 = sVar26 + 1;
      } while (sVar26 != 0);
    }
    iVar15 = (*((branchTarget->super_Instr).m_func)->m_scriptContextInfo->_vptr_ScriptContextInfo[1]
             )();
    src = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar15),AddrOpndKindDynamicVar,
                            (branchTarget->super_Instr).m_func,true,(Var)0x0);
    pRVar19 = IR::RegOpnd::New(TyUint64,this->m_func);
    InsertMove(&pRVar19->super_Opnd,&src->super_Opnd,&branchTarget->super_Instr,true);
    this_00 = (BVSparse<Memory::JitArenaAllocator> *)
              new<Memory::JitArenaAllocator>(0x20,this->m_alloc,0x3eba5c);
    pJVar5 = this->m_alloc;
    this_00->head = (Type_conflict)0x0;
    this_00->lastFoundIndex = (Type_conflict)0x0;
    this_00->alloc = pJVar5;
    this_00->lastUsedNodePrevNextField = (Type)this_00;
    pLVar21 = branchTarget;
    local_50 = instrArgIn;
    if (uVar12 != 0) {
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      pLVar24 = branchTarget;
      local_50 = instrArgIn;
      do {
        pOVar4 = local_50->m_dst;
        OVar9 = IR::Opnd::GetKind(pOVar4);
        if (OVar9 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2d80,"(dstOpnd->IsRegOpnd())","dstOpnd->IsRegOpnd()");
          if (!bVar8) goto LAB_005b2e4e;
          *puVar16 = 0;
        }
        OVar9 = IR::Opnd::GetKind(pOVar4);
        if (OVar9 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar8) goto LAB_005b2e4e;
          *puVar16 = 0;
        }
        pp_Var6 = pOVar4[1]._vptr_Opnd;
        if (*(char *)((long)pp_Var6 + 0x14) != '\x01') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar8) goto LAB_005b2e4e;
          *puVar16 = 0;
        }
        BVar10 = BVSparse<Memory::JitArenaAllocator>::TestAndSet(this_00,*(BVIndex *)(pp_Var6 + 2));
        InsertMove(pOVar4,&pRVar19->super_Opnd,&branchTarget->super_Instr,true);
        pLVar21 = IR::LabelInstr::New(Label,this->m_func,false);
        IR::Instr::InsertAfter(&pLVar24->super_Instr,&pLVar21->super_Instr);
        pIVar18 = local_50->m_prev;
        IR::Instr::Unlink(local_50);
        pOVar4 = local_50->m_src1;
        OVar9 = IR::Opnd::GetKind(pOVar4);
        if (OVar9 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar8) goto LAB_005b2e4e;
          *puVar16 = 0;
        }
        pSVar3 = (StackSym *)pOVar4[1]._vptr_Opnd;
        if ((pSVar3->super_Sym).m_kind != SymKindStack) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar8) goto LAB_005b2e4e;
          *puVar16 = 0;
        }
        AVar13 = StackSym::GetParamSlotNum(pSVar3);
        if (BVar10 == '\0') {
          ConvertArgOpndIfGeneratorFunction(this,local_50,local_88);
          IR::Instr::InsertBefore(&pLVar21->super_Instr,local_50);
          LowererMD::ChangeToAssign(local_50);
        }
        else {
          IR::Instr::Free(local_50);
        }
        while (pIVar18->m_opcode != ArgIn_A) {
          pIVar18 = pIVar18->m_prev;
          if (pIVar18 == (Instr *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar16 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x2daf,"(instrArgIn)","???");
            if (!bVar8) goto LAB_005b2e4e;
            *puVar16 = 0;
          }
        }
        pOVar4 = pIVar18->m_src1;
        OVar9 = IR::Opnd::GetKind(pOVar4);
        if (OVar9 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar8) goto LAB_005b2e4e;
          *puVar16 = 0;
        }
        pSVar3 = (StackSym *)pOVar4[1]._vptr_Opnd;
        if ((pSVar3->super_Sym).m_kind != SymKindStack) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar8) goto LAB_005b2e4e;
          *puVar16 = 0;
        }
        AVar14 = StackSym::GetParamSlotNum(pSVar3);
        if (AVar13 == AVar14) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2db6,"(diffSlotsNum > 0)","Argins are not in order?");
          if (!bVar8) goto LAB_005b2e4e;
          *puVar16 = 0;
        }
        else {
          sVar26 = AVar14 - AVar13;
          do {
            pIVar23 = IR::IntConstOpnd::New(1,TyInt64,this->m_func,false);
            InsertAdd(true,pOVar2,pOVar2,&pIVar23->super_Opnd,&branchTarget->super_Instr);
            InsertBranch(BrEq_A,false,pLVar21,&branchTarget->super_Instr);
            sVar26 = sVar26 + 1;
          } while (sVar26 != 0);
        }
        pOVar4 = pIVar18->m_src1;
        OVar9 = IR::Opnd::GetKind(pOVar4);
        if (OVar9 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar8) goto LAB_005b2e4e;
          *puVar16 = 0;
        }
        pSVar3 = (StackSym *)pOVar4[1]._vptr_Opnd;
        if ((pSVar3->super_Sym).m_kind != SymKindStack) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar8) goto LAB_005b2e4e;
          *puVar16 = 0;
        }
        AVar13 = StackSym::GetParamSlotNum(pSVar3);
        if (AVar11 < AVar13) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2dc0,
                             "(instrArgIn->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum() <= formalsCount)"
                             ,"Expect all ArgIn\'s to be in numerical order by param slot");
          if (!bVar8) goto LAB_005b2e4e;
          *puVar16 = 0;
        }
        uVar12 = uVar12 - 1;
        pLVar24 = pLVar21;
        local_50 = pIVar18;
      } while (uVar12 != 0);
    }
    pOVar4 = local_50->m_dst;
    OVar9 = IR::Opnd::GetKind(pOVar4);
    if (OVar9 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2dc9,"(dstOpnd->IsRegOpnd())","dstOpnd->IsRegOpnd()");
      if (!bVar8) goto LAB_005b2e4e;
      *puVar16 = 0;
    }
    OVar9 = IR::Opnd::GetKind(pOVar4);
    if (OVar9 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar8) goto LAB_005b2e4e;
      *puVar16 = 0;
    }
    pp_Var6 = pOVar4[1]._vptr_Opnd;
    if (*(char *)((long)pp_Var6 + 0x14) != '\x01') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar8) {
LAB_005b2e4e:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar16 = 0;
    }
    BVar10 = BVSparse<Memory::JitArenaAllocator>::TestAndSet(this_00,*(BVIndex *)(pp_Var6 + 2));
    InsertMove(pOVar4,&pRVar19->super_Opnd,&branchTarget->super_Instr,true);
    if (OVar1 == ArgIn_Rest) {
      pIVar23 = IR::IntConstOpnd::New(0,TyUint8,this->m_func,false);
      InsertMove(pOVar2,&pIVar23->super_Opnd,&branchTarget->super_Instr,true);
    }
    pLVar24 = IR::LabelInstr::New(Label,this->m_func,false);
    pBVar22 = IR::BranchInstr::New(JMP,pLVar24,this->m_func);
    IR::Instr::InsertBefore(&branchTarget->super_Instr,&pBVar22->super_Instr);
    IR::Instr::InsertAfter(&pLVar21->super_Instr,&pLVar24->super_Instr);
    if (OVar1 == ArgIn_Rest) {
      AVar11 = Func::GetInParamsCount(this->m_func);
      pIVar23 = IR::IntConstOpnd::New((ulong)AVar11,TyUint32,this->m_func,false);
      LowerRestParameter(this,&pIVar23->super_Opnd,dstOpnd,pOVar2,&pLVar24->super_Instr,local_88);
    }
    IR::Instr::Unlink(local_50);
    if (BVar10 == '\0') {
      ConvertArgOpndIfGeneratorFunction(this,local_50,local_88);
      IR::Instr::InsertBefore(&pLVar24->super_Instr,local_50);
      LowererMD::ChangeToAssign(local_50);
    }
    else {
      IR::Instr::Free(local_50);
    }
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (this->m_alloc,this_00);
  }
  return local_70;
}

Assistant:

IR::Instr *
Lowerer::LowerArgIn(IR::Instr *instrArgIn)
{
    IR::LabelInstr *   labelDone;
    IR::LabelInstr *   labelUndef;
    IR::LabelInstr *   labelNormal;
    IR::LabelInstr *   labelInit;
    IR::LabelInstr *   labelInitNext;
    IR::BranchInstr *  instrBranch;
    IR::Instr *        instrArgInNext;
    IR::Instr *        instrInsert;
    IR::Instr *        instrPrev;
    IR::Instr *        instrResume = nullptr;
    IR::Opnd *         dstOpnd;
    IR::Opnd *         srcOpnd;
    IR::Opnd *         opndUndef;
    Js::ArgSlot        argIndex;
    StackSym *         symParam;
    BOOLEAN            isDuplicate;
    IR::RegOpnd *      generatorArgsPtrOpnd = nullptr;

    // We start with:
    // s1 = ArgIn_A param1
    // s2 = ArgIn_A param2
    // ...
    // sn = ArgIn_A paramn
    //
    // We want to end up with:
    //
    // s1 = ArgIn_A param1            -- Note that this is unconditional
    // count = (load from param area)
    //     BrLt_A $start, count, n    -- Forward cbranch to the uncommon case
    //     Br $Ln
    // $start:
    //     sn = assign undef
    //     BrGe_A $Ln-1, count, n-1
    //     sn-1 = assign undef
    // ...
    //     s2 = assign undef
    //     Br $done
    // $Ln:
    //     sn = assign paramn
    // $Ln-1:
    //     sn-1 = assign paramn-1
    // ...
    //     s2 = assign param2
    // $done:

    AnalysisAssert(instrArgIn);

    IR::Opnd *restDst = nullptr;
    bool hasRest = instrArgIn->m_opcode == Js::OpCode::ArgIn_Rest;
    if (hasRest)
    {
        IR::Instr *restInstr = instrArgIn;
        restDst = restInstr->UnlinkDst();
        if (m_func->GetJITFunctionBody()->HasImplicitArgIns() && m_func->argInsCount > 0)
        {
            while (instrArgIn->m_opcode != Js::OpCode::ArgIn_A)
            {
                instrArgIn = instrArgIn->m_prev;
                if (instrResume == nullptr)
                {
                    instrResume = instrArgIn;
                }
            }
            restInstr->Remove();
        }
        else
        {
            Assert(instrArgIn->m_func == this->m_func);
            IR::Instr * instrCount = m_lowererMD.LoadInputParamCount(instrArgIn, -this->m_func->GetInParamsCount());
            IR::Opnd * excessOpnd = instrCount->GetDst();

            IR::LabelInstr *createRestArrayLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

            // BrGe $createRestArray, excess, 0
            InsertCompareBranch(excessOpnd, IR::IntConstOpnd::New(0, TyUint8, this->m_func), Js::OpCode::BrGe_A, createRestArrayLabel, instrArgIn);

            // MOV excess, 0
            InsertMove(excessOpnd, IR::IntConstOpnd::New(0, TyUint8, this->m_func), instrArgIn);

            // $createRestArray
            instrArgIn->InsertBefore(createRestArrayLabel);

            if (m_func->GetJITFunctionBody()->IsCoroutine())
            {
                AssertMsg(!m_func->IsLoopBody(), "LoopBody Jit should not involve Rest params");
                generatorArgsPtrOpnd = LoadGeneratorArgsPtr(instrArgIn);
            }

            IR::IntConstOpnd * formalsOpnd = IR::IntConstOpnd::New(this->m_func->GetInParamsCount(), TyUint32, this->m_func);
            IR::Instr *prev = LowerRestParameter(formalsOpnd, restDst, excessOpnd, instrArgIn, generatorArgsPtrOpnd);
            instrArgIn->Remove();
            return prev;
        }
    }

    srcOpnd = instrArgIn->GetSrc1();
    symParam = srcOpnd->AsSymOpnd()->m_sym->AsStackSym();

    argIndex = symParam->GetParamSlotNum();
    if (argIndex == 1)
    {
        // The "this" argument is not source-dependent and doesn't need to be checked.
        if (m_func->GetJITFunctionBody()->IsCoroutine() && !m_func->IsLoopBody())
        {
            generatorArgsPtrOpnd = LoadGeneratorArgsPtr(instrArgIn);
            ConvertArgOpndIfGeneratorFunction(instrArgIn, generatorArgsPtrOpnd);
        }

        m_lowererMD.ChangeToAssign(instrArgIn);
        return instrResume == nullptr ? instrArgIn->m_prev : instrResume;
    }

    Js::ArgSlot formalsCount = this->m_func->GetInParamsCount();

    AssertMsg(argIndex <= formalsCount, "Expect to see the ArgIn's within the range of the formals");

    // Because there may be instructions between the ArgIn's, such as saves to the frame object,
    // we find the top of the sequence of ArgIn's and insert everything there. This assumes that
    // ArgIn's use param symbols as src's and not the results of previous instructions.

    instrPrev = instrArgIn;
    Js::ArgSlot currArgInCount = 0;
    Assert(this->m_func->argInsCount > 0);

    while (currArgInCount < this->m_func->argInsCount - 1)
    {
        instrPrev = instrPrev->m_prev;
        if (instrPrev->m_opcode == Js::OpCode::ArgIn_A)
        {
            srcOpnd = instrPrev->GetSrc1();
            symParam = srcOpnd->AsSymOpnd()->m_sym->AsStackSym();
            AssertMsg(symParam->GetParamSlotNum() < argIndex, "ArgIn's not in numerical order");
            argIndex = symParam->GetParamSlotNum();
            currArgInCount++;
        }
        else
        {
            // Make sure that this instruction gets lowered.
            if (instrResume == nullptr)
            {
                instrResume = instrPrev;
            }
        }
    }
    // The loading of parameters will be inserted above this instruction.
    instrInsert = instrPrev;

    AnalysisAssert(instrInsert);
    if (instrResume == nullptr)
    {
        // We found no intervening non-ArgIn's, so lowering can resume at the previous instruction.
        instrResume = instrInsert->m_prev;
    }

    // Now insert all the checks and undef-assigns.

    if (m_func->GetJITFunctionBody()->IsCoroutine())
    {
        generatorArgsPtrOpnd = LoadGeneratorArgsPtr(instrInsert);
    }

    // excessOpnd = (load from param area) - formalCounts
    IR::Instr * instrCount = this->m_lowererMD.LoadInputParamCount(instrInsert, -formalsCount, true);
    IR::Opnd * excessOpnd = instrCount->GetDst();

    labelUndef = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, /*helperLabel*/ true);
    Lowerer::InsertBranch(Js::OpCode::BrLt_A, labelUndef, instrInsert);

    //     Br $Ln

    labelNormal = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    labelInit = labelNormal;
    instrBranch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelNormal, this->m_func);
    instrInsert->InsertBefore(instrBranch);

    // Insert the labels

    instrInsert->InsertBefore(labelUndef);
    instrInsert->InsertBefore(labelNormal);

    //Adjustment for deadstore of ArgIn_A
    Js::ArgSlot highestSlotNum = instrArgIn->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum();
    Js::ArgSlot missingSlotNums = this->m_func->GetInParamsCount() - highestSlotNum;
    Assert(missingSlotNums >= 0);
    while (missingSlotNums > 0)
    {
        InsertAdd(true, excessOpnd, excessOpnd, IR::IntConstOpnd::New(1, TyMachReg, this->m_func), labelNormal);
        Lowerer::InsertBranch(Js::OpCode::BrEq_A, labelNormal, labelNormal);
        missingSlotNums--;
    }

    // MOV undefReg, undefAddress
    IR::Opnd* opndUndefAddress = this->LoadLibraryValueOpnd(labelNormal, LibraryValue::ValueUndefined);
    opndUndef =  IR::RegOpnd::New(TyMachPtr, this->m_func);
    Lowerer::InsertMove(opndUndef, opndUndefAddress, labelNormal);

    BVSparse<JitArenaAllocator> *formalsBv = JitAnew(this->m_alloc, BVSparse<JitArenaAllocator>, this->m_alloc);

    while (currArgInCount > 0)
    {
        dstOpnd = instrArgIn->GetDst();

        Assert(dstOpnd->IsRegOpnd());
        isDuplicate = formalsBv->TestAndSet(dstOpnd->AsRegOpnd()->m_sym->AsStackSym()->m_id);

        // Now insert the undef initialization before the "normal" label

        //     sn = assign undef

        Lowerer::InsertMove(dstOpnd, opndUndef, labelNormal);

        //     INC excessOpnd
        //     BrEq_A $Ln-1

        currArgInCount--;

        labelInitNext = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

        // And insert the "normal" initialization before the "done" label

        //     sn = assign paramn
        // $Ln-1:

        labelInit->InsertAfter(labelInitNext);
        labelInit = labelInitNext;

        instrArgInNext = instrArgIn->m_prev;
        instrArgIn->Unlink();

        Js::ArgSlot prevParamSlotNum = instrArgIn->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum();

        //      function foo(x, x)  { use(x); }
        // This should refer to the second 'x'.  Since we reverse the order here however, we need to skip
        // the initialization of the first 'x' to not override the one for the second.  WOOB:1105504
        if (isDuplicate)
        {
            instrArgIn->Free();
        }
        else
        {
            ConvertArgOpndIfGeneratorFunction(instrArgIn, generatorArgsPtrOpnd);
            labelInit->InsertBefore(instrArgIn);
            this->m_lowererMD.ChangeToAssign(instrArgIn);
        }
        instrArgIn = instrArgInNext;

        while (instrArgIn->m_opcode != Js::OpCode::ArgIn_A)
        {
            instrArgIn = instrArgIn->m_prev;
            AssertMsg(instrArgIn, "???");
        }

        //Adjustment for deadstore of ArgIn_A
        Js::ArgSlot currParamSlotNum = instrArgIn->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum();
        Js::ArgSlot diffSlotsNum = prevParamSlotNum - currParamSlotNum;

        AssertMsg(diffSlotsNum > 0, "Argins are not in order?");

        while (diffSlotsNum > 0)
        {
            InsertAdd(true, excessOpnd, excessOpnd, IR::IntConstOpnd::New(1, TyMachReg, this->m_func), labelNormal);
            InsertBranch(Js::OpCode::BrEq_A, labelInitNext, labelNormal);
            diffSlotsNum--;
        }

        AssertMsg(instrArgIn->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum() <= formalsCount,
                  "Expect all ArgIn's to be in numerical order by param slot");
    }

    // Insert final undef and normal initializations, jumping unconditionally to the end
    // rather than checking against the decremented formals count as we did inside the loop above.

    //     s2 = assign undef

    dstOpnd = instrArgIn->GetDst();
    Assert(dstOpnd->IsRegOpnd());
    isDuplicate = formalsBv->TestAndSet(dstOpnd->AsRegOpnd()->m_sym->AsStackSym()->m_id);

    Lowerer::InsertMove(dstOpnd, opndUndef, labelNormal);

    if (hasRest)
    {
        InsertMove(excessOpnd, IR::IntConstOpnd::New(0, TyUint8, this->m_func), labelNormal);
    }

    //     Br $done

    labelDone = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instrBranch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func);
    labelNormal->InsertBefore(instrBranch);

    //     s2 = assign param2
    // $done:

    labelInit->InsertAfter(labelDone);

    if (hasRest)
    {
        // The formals count has been tainted, so restore it before lowering rest
        IR::IntConstOpnd * formalsOpnd = IR::IntConstOpnd::New(this->m_func->GetInParamsCount(), TyUint32, this->m_func);
        LowerRestParameter(formalsOpnd, restDst, excessOpnd, labelDone, generatorArgsPtrOpnd);
    }

    instrArgIn->Unlink();
    if (isDuplicate)
    {
        instrArgIn->Free();
    }
    else
    {
        ConvertArgOpndIfGeneratorFunction(instrArgIn, generatorArgsPtrOpnd);
        labelDone->InsertBefore(instrArgIn);
        this->m_lowererMD.ChangeToAssign(instrArgIn);
    }

    JitAdelete(this->m_alloc, formalsBv);

    return instrResume;
}